

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

int list_find(ListNode *head,void *value,EqualityFunction equal_func,ListNode **output)

{
  int iVar1;
  char *in_RCX;
  code *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  ListNode *current;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  undefined8 *puVar2;
  
  _assert_true((unsigned_long)in_RDX,in_RCX,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  puVar2 = (undefined8 *)in_RDI[2];
  while( true ) {
    if (puVar2 == in_RDI) {
      return 0;
    }
    iVar1 = (*in_RDX)(*puVar2,in_RSI);
    if (iVar1 != 0) break;
    puVar2 = (undefined8 *)puVar2[2];
  }
  *(undefined8 **)in_RCX = puVar2;
  return 1;
}

Assistant:

static int list_find(ListNode * const head, const void *value,
                     const EqualityFunction equal_func, ListNode **output) {
    ListNode *current;
    assert_non_null(head);
    for (current = head->next; current != head; current = current->next) {
        if (equal_func(current->value, value)) {
            *output = current;
            return 1;
        }
    }
    return 0;
}